

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O3

void rtosc_v2argvals(rtosc_arg_val_t *args,size_t nargs,char *arg_str,__va_list_tag *ap)

{
  rtosc_va_list_t ap2;
  __va_list_tag local_38;
  
  local_38.reg_save_area = ap->reg_save_area;
  local_38.gp_offset = ap->gp_offset;
  local_38.fp_offset = ap->fp_offset;
  local_38.overflow_arg_area = ap->overflow_arg_area;
  if (nargs != 0) {
    do {
      args->type = *arg_str;
      rtosc_v2args(&args->val,1,arg_str,(rtosc_va_list_t *)&local_38);
      arg_str = arg_str + 1;
      args = args + 1;
      nargs = nargs - 1;
    } while (nargs != 0);
  }
  return;
}

Assistant:

void rtosc_v2argvals(rtosc_arg_val_t *args,
                     size_t           nargs,
                     const char     * arg_str,
                     va_list          ap)
{
    rtosc_va_list_t ap2;
    va_copy(ap2.a, ap);
    for(size_t i=0; i<nargs; ++i, ++arg_str, ++args)
    {
        args->type = *arg_str;
        rtosc_v2args(&args->val, 1, arg_str, &ap2);
    }
    va_end(ap2.a);
}